

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O1

void reset_input_controller(j_decompress_ptr cinfo)

{
  jpeg_input_controller *pjVar1;
  
  pjVar1 = cinfo->inputctl;
  pjVar1->consume_input = consume_markers;
  pjVar1->has_multiple_scans = 0;
  pjVar1->eoi_reached = 0;
  *(undefined4 *)&pjVar1[1].consume_input = 1;
  (*cinfo->err->reset_error_mgr)((j_common_ptr)cinfo);
  (*cinfo->marker->reset_marker_reader)(cinfo);
  cinfo->coef_bits = (int (*) [64])0x0;
  return;
}

Assistant:

METHODDEF(void)
reset_input_controller(j_decompress_ptr cinfo)
{
  my_inputctl_ptr inputctl = (my_inputctl_ptr)cinfo->inputctl;

  inputctl->pub.consume_input = consume_markers;
  inputctl->pub.has_multiple_scans = FALSE; /* "unknown" would be better */
  inputctl->pub.eoi_reached = FALSE;
  inputctl->inheaders = TRUE;
  /* Reset other modules */
  (*cinfo->err->reset_error_mgr) ((j_common_ptr)cinfo);
  (*cinfo->marker->reset_marker_reader) (cinfo);
  /* Reset progression state -- would be cleaner if entropy decoder did this */
  cinfo->coef_bits = NULL;
}